

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O0

bool Imath_3_2::extractAndRemoveScalingAndShear<float>
               (Matrix33<float> *mat,Vec2<float> *scl,float *shr,bool exc)

{
  bool bVar1;
  float *pfVar2;
  byte in_CL;
  float *in_RDX;
  Vec2<float> *in_RSI;
  Matrix33<float> *in_RDI;
  float fVar3;
  float fVar4;
  int i_2;
  int i_1;
  int j;
  int i;
  float maxVal;
  Vec2<float> row [2];
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float a;
  Vec2<float> *pVVar5;
  undefined1 exc_00;
  Vec2<float> *this;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int i_00;
  Vec2<float> local_60;
  int local_58;
  int local_54;
  int local_50;
  float local_4c;
  Vec2<float> local_48;
  Vec2<float> local_40;
  Vec2<float> local_38;
  Vec2<float> local_30;
  Vec2<float> VStack_28;
  float *local_20;
  Vec2<float> *local_18;
  Matrix33<float> *local_10;
  bool local_1;
  
  VStack_28.y._3_1_ = in_CL & 1;
  this = &local_38;
  pVVar5 = &VStack_28;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    Vec2<float>::Vec2(this);
    this = this + 1;
  } while (this != pVVar5);
  pfVar2 = Matrix33<float>::operator[](local_10,0);
  fVar4 = *pfVar2;
  pfVar2 = Matrix33<float>::operator[](local_10,0);
  Vec2<float>::Vec2(&local_40,fVar4,pfVar2[1]);
  Vec2<float>::operator=(&local_38,&local_40);
  pfVar2 = Matrix33<float>::operator[](local_10,1);
  a = *pfVar2;
  pfVar2 = Matrix33<float>::operator[](local_10,1);
  Vec2<float>::Vec2(&local_48,a,pfVar2[1]);
  Vec2<float>::operator=(&local_30,&local_48);
  local_4c = 0.0;
  for (local_50 = 0; exc_00 = (undefined1)((ulong)pVVar5 >> 0x38), local_50 < 2;
      local_50 = local_50 + 1) {
    for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
      pfVar2 = Matrix33<float>::operator[](local_10,local_50);
      fVar3 = abs<float>(pfVar2[local_54]);
      if (local_4c < fVar3) {
        pfVar2 = Matrix33<float>::operator[](local_10,local_50);
        local_4c = abs<float>(pfVar2[local_54]);
      }
    }
  }
  if ((local_4c != 0.0) || (NAN(local_4c))) {
    for (local_58 = 0; exc_00 = (undefined1)((ulong)pVVar5 >> 0x38), local_58 < 2;
        local_58 = local_58 + 1) {
      bVar1 = checkForZeroScaleInRow<float>
                        ((float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),this
                         ,(bool)exc_00);
      if (!bVar1) {
        return false;
      }
      Vec2<float>::operator/=(&local_38 + local_58,local_4c);
    }
  }
  fVar3 = Vec2<float>::length((Vec2<float> *)CONCAT44(a,fVar4));
  local_18->x = fVar3;
  bVar1 = checkForZeroScaleInRow<float>
                    ((float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),this,
                     (bool)exc_00);
  if (bVar1) {
    Vec2<float>::operator/=(&local_38,local_18->x);
    fVar3 = Vec2<float>::dot(&local_38,&local_30);
    *local_20 = fVar3;
    operator*(a,(Vec2<float> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    Vec2<float>::operator-=(&local_30,&local_60);
    fVar4 = Vec2<float>::length((Vec2<float> *)CONCAT44(a,fVar4));
    local_18->y = fVar4;
    bVar1 = checkForZeroScaleInRow<float>
                      ((float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),this,
                       (bool)exc_00);
    if (bVar1) {
      Vec2<float>::operator/=(&local_30,local_18->y);
      *local_20 = *local_20 / local_18->y;
      if (local_38.x * local_30.y + -(local_38.y * local_30.x) < 0.0) {
        local_30.x = local_30.x * -1.0;
        local_30.y = local_30.y * -1.0;
        local_18->y = local_18->y * -1.0;
        *local_20 = *local_20 * -1.0;
      }
      for (i_00 = 0; i_00 < 2; i_00 = i_00 + 1) {
        fVar4 = (&local_38)[i_00].x;
        pfVar2 = Matrix33<float>::operator[](local_10,i_00);
        *pfVar2 = fVar4;
        fVar4 = (&local_38)[i_00].y;
        pfVar2 = Matrix33<float>::operator[](local_10,i_00);
        pfVar2[1] = fVar4;
      }
      Vec2<float>::operator*=(local_18,local_4c);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
extractAndRemoveScalingAndShear (
    Matrix33<T>& mat, Vec2<T>& scl, T& shr, bool exc)
{
    Vec2<T> row[2];

    row[0] = Vec2<T> (mat[0][0], mat[0][1]);
    row[1] = Vec2<T> (mat[1][0], mat[1][1]);

    T maxVal = 0;
    for (int i = 0; i < 2; i++)
        for (int j = 0; j < 2; j++)
            if (IMATH_INTERNAL_NAMESPACE::abs (mat[i][j]) > maxVal)
                maxVal = IMATH_INTERNAL_NAMESPACE::abs (mat[i][j]);

    //
    // We normalize the 2x2 matrix here.
    // It was noticed that this can improve numerical stability significantly,
    // especially when many of the upper 2x2 matrix's coefficients are very
    // close to zero; we correct for this step at the end by multiplying the
    // scaling factors by maxVal at the end (shear and rotation are not
    // affected by the normalization).

    if (maxVal != 0)
    {
        for (int i = 0; i < 2; i++)
            if (!checkForZeroScaleInRow (maxVal, row[i], exc))
                return false;
            else
                row[i] /= maxVal;
    }

    // Compute X scale factor.
    scl.x = row[0].length ();
    if (!checkForZeroScaleInRow (scl.x, row[0], exc)) return false;

    // Normalize first row.
    row[0] /= scl.x;

    // An XY shear factor will shear the X coord. as the Y coord. changes.
    // There are 2 combinations (XY, YX), although we only extract the XY
    // shear factor because we can effect the an YX shear factor by
    // shearing in XY combined with rotations and scales.
    //
    // shear matrix <   1,  YX,  0,
    //                 XY,   1,  0,
    //                  0,   0,  1 >

    // Compute XY shear factor and make 2nd row orthogonal to 1st.
    shr = row[0].dot (row[1]);
    row[1] -= shr * row[0];

    // Now, compute Y scale.
    scl.y = row[1].length ();
    if (!checkForZeroScaleInRow (scl.y, row[1], exc)) return false;

    // Normalize 2nd row and correct the XY shear factor for Y scaling.
    row[1] /= scl.y;
    shr /= scl.y;

    // At this point, the upper 2x2 matrix in mat is orthonormal.
    // Check for a coordinate system flip. If the determinant
    // is -1, then flip the rotation matrix and adjust the scale(Y)
    // and shear(XY) factors to compensate.
    if (row[0].x * row[1].y - row[0].y * row[1].x < 0)
    {
        row[1].x *= -1;
        row[1].y *= -1;
        scl.y *= -1;
        shr *= -1;
    }

    // Copy over the orthonormal rows into the returned matrix.
    // The upper 2x2 matrix in mat is now a rotation matrix.
    for (int i = 0; i < 2; i++)
    {
        mat[i][0] = row[i].x;
        mat[i][1] = row[i].y;
    }

    scl *= maxVal;

    return true;
}